

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetTxInIssuanceInfoByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  int64_t *in_R9;
  Amount AVar3;
  undefined8 *in_stack_00000008;
  int64_t *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  CfdException *except;
  exception *std_except;
  ConfidentialValue *token_obj;
  ConfidentialValue *asset_obj;
  ConfidentialTxInReference ref;
  ConfidentialTransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  char *work_token_rangeproof;
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  ConfidentialTxInReference *in_stack_fffffffffffffac8;
  ConfidentialTxInReference *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffaf0;
  int64_t local_4f8;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  string *in_stack_fffffffffffffb30;
  int64_t local_4c8;
  ByteData local_468;
  string local_450;
  string *in_stack_fffffffffffffbd8;
  pointer in_stack_fffffffffffffbe0;
  string local_418;
  string local_3f8;
  int64_t local_3d8;
  undefined1 local_3d0;
  Amount local_3c8;
  string local_3b8;
  string *local_398;
  undefined1 local_390;
  Amount local_388;
  ConfidentialValue local_378;
  ConfidentialValue *local_350;
  ConfidentialValue local_348;
  ConfidentialValue *local_320;
  ByteData256 local_318;
  BlindFactor local_300;
  string local_2e0;
  ByteData256 local_2c0;
  BlindFactor local_2a8;
  string local_288;
  ConfidentialTxInReference local_268;
  ConfidentialTransaction *local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [39];
  byte local_a9;
  long local_a8;
  allocator local_99;
  string local_98 [48];
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  int64_t *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"TransactionData",&local_99);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_a8 = local_18;
  local_a9 = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_fffffffffffffb30 >> 0x20),
             (bool *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  if (*(long *)(local_a8 + 0x18) == 0) {
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Invalid handle state. tx is null",&local_d1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffaf0,error_code,in_stack_fffffffffffffae0);
    local_d2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_a9 & 1) != 0) {
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Invalid handle state. tx is bitcoin.",&local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffaf0,error_code,in_stack_fffffffffffffae0);
    local_fa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_108 = *(ConfidentialTransaction **)(local_a8 + 0x18);
  cfd::core::ConfidentialTransaction::GetTxIn(&local_268,local_108,local_1c);
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxInReference::GetAssetEntropy(in_stack_fffffffffffffac8);
    cfd::core::BlindFactor::BlindFactor(&local_2a8,&local_2c0);
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_288,&local_2a8);
    local_40 = cfd::capi::CreateString(in_stack_fffffffffffffb30);
    std::__cxx11::string::~string((string *)&local_288);
    cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5bce85);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5bce92);
  }
  if (local_30 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffffac8);
    cfd::core::BlindFactor::BlindFactor(&local_300,&local_318);
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_2e0,&local_300);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffffb30);
    std::__cxx11::string::~string((string *)&local_2e0);
    cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5bcfb1);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5bcfbe);
  }
  cfd::core::ConfidentialTxInReference::GetIssuanceAmount(in_stack_fffffffffffffac8);
  local_320 = &local_348;
  cfd::core::ConfidentialTxInReference::GetInflationKeys(in_stack_fffffffffffffac8);
  local_350 = &local_378;
  if (local_38 != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_320);
    if (!bVar1) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_320);
      if (bVar1) {
        local_4c8 = 0;
      }
      else {
        AVar3 = cfd::core::ConfidentialValue::GetAmount(local_320);
        in_stack_fffffffffffffb30 = (string *)AVar3.amount_;
        local_390 = AVar3.ignore_check_;
        local_398 = in_stack_fffffffffffffb30;
        local_388.amount_ = (int64_t)in_stack_fffffffffffffb30;
        local_388.ignore_check_ = (bool)local_390;
        local_4c8 = cfd::core::Amount::GetSatoshiValue(&local_388);
      }
      *local_38 = local_4c8;
    }
  }
  if (in_stack_00000008 != (undefined8 *)0x0) {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_3b8,local_320);
    local_50 = cfd::capi::CreateString(in_stack_fffffffffffffb30);
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  if (in_stack_00000010 != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_350);
    if (!bVar1) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_350);
      if (bVar1) {
        local_4f8 = 0;
      }
      else {
        AVar3 = cfd::core::ConfidentialValue::GetAmount(local_350);
        local_3d8 = AVar3.amount_;
        local_3d0 = AVar3.ignore_check_;
        local_3c8.amount_ = local_3d8;
        local_3c8.ignore_check_ = (bool)local_3d0;
        local_4f8 = cfd::core::Amount::GetSatoshiValue(&local_3c8);
      }
      *in_stack_00000010 = local_4f8;
    }
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_3f8,local_350);
    local_58 = cfd::capi::CreateString(in_stack_fffffffffffffb30);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  if (in_stack_00000020 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxInReference::GetIssuanceAmountRangeproof(in_stack_fffffffffffffac8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_418,(ByteData *)&stack0xfffffffffffffbd0);
    local_60 = cfd::capi::CreateString(in_stack_fffffffffffffb30);
    std::__cxx11::string::~string((string *)&local_418);
    cfd::core::ByteData::~ByteData((ByteData *)0x5bd3be);
  }
  if (in_stack_00000028 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxInReference::GetInflationKeysRangeproof(in_stack_fffffffffffffac8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_450,&local_468);
    local_68 = cfd::capi::CreateString(in_stack_fffffffffffffb30);
    std::__cxx11::string::~string((string *)&local_450);
    cfd::core::ByteData::~ByteData((ByteData *)0x5bd481);
  }
  if (local_40 != (char *)0x0) {
    *local_28 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *local_30 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *in_stack_00000008 = local_50;
  }
  if (local_58 != (char *)0x0) {
    *in_stack_00000018 = local_58;
  }
  if (local_60 != (char *)0x0) {
    *in_stack_00000020 = local_60;
  }
  if (local_68 != (char *)0x0) {
    *in_stack_00000028 = local_68;
  }
  local_4 = 0;
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5bd598);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5bd5a5);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffad0);
  return local_4;
}

Assistant:

int CfdGetTxInIssuanceInfoByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxInReference ref = tx->GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}